

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O0

void __thiscall
powerpc_test_cpu::test_instruction_RRI__(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  uint32_t a1;
  int iVar1;
  int local_44;
  uint32_t ra;
  int i;
  uint32_t op;
  uint32_t im;
  int j;
  int n_imm_values;
  int n_reg_values;
  uint32_t local_1c;
  char *pcStack_18;
  uint32_t opcode_local;
  char *insn_local;
  powerpc_test_cpu *this_local;
  
  local_1c = opcode;
  pcStack_18 = insn;
  insn_local = (char *)this;
  if (test_instruction_RRI__(char_const*,unsigned_int)::code == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      test_instruction_RRI__::code[0] = 0;
      test_instruction_RRI__::code[1] = 0x4e800020;
      test_instruction_RRI__::code[2] = POWERPC_MR(0,4);
      test_instruction_RRI__::code[3] = 0;
      test_instruction_RRI__::code[4] = 0x4e800020;
      __cxa_guard_release(&test_instruction_RRI__(char_const*,unsigned_int)::code);
    }
  }
  j = 0x24;
  im = 0x24;
  for (op = 0; (int)op < 0x24; op = op + 1) {
    i = imm_values[(int)op];
    ra = local_1c;
    bit_field<16,_31>::insert(&ra,i);
    test_instruction_RRI__::code[3] = ra;
    test_instruction_RRI__::code[0] = ra;
    bit_field<11,_15>::insert(test_instruction_RRI__::code + 3,0);
    flush_icache_range(this,test_instruction_RRI__::code,0x14);
    for (local_44 = 0; local_44 < 0x24; local_44 = local_44 + 1) {
      a1 = reg_values[local_44];
      test_one(this,test_instruction_RRI__::code,pcStack_18,a1,i,0,0);
      test_one(this,test_instruction_RRI__::code + 2,pcStack_18,a1,i,0,0);
    }
  }
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_RRI__(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_reg_values = sizeof(reg_values)/sizeof(reg_values[0]);
	const int n_imm_values = sizeof(imm_values)/sizeof(imm_values[0]);

	for (int j = 0; j < n_imm_values; j++) {
		const uint32_t im = imm_values[j];
		uint32_t op = opcode;
		UIMM_field::insert(op, im);
		code[0] = code[3] = op;				// <op> RD,RA,IM
		rA_field::insert(code[3], 0);		// <op> RD,R0,IM
		flush_icache_range(code, sizeof(code));
		for (int i = 0; i < n_reg_values; i++) {
			const uint32_t ra = reg_values[i];
			test_one(&code[0], insn, ra, im, 0);
			test_one(&code[2], insn, ra, im, 0);
		}
	}
}